

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O0

void * rw::matfxOpen(void *o,int32 param_2,int32 param_3)

{
  uint local_1c;
  uint i;
  int32 param_2_local;
  int32 param_1_local;
  void *o_local;
  
  DAT_00168c08 = ObjPipeline::create();
  (DAT_00168c08->super_Pipeline).pluginID = 0;
  (DAT_00168c08->super_Pipeline).pluginData = 0;
  for (local_1c = 0; local_1c < 0xd; local_1c = local_1c + 1) {
    *(ObjPipeline **)(&DAT_00168ba0 + (ulong)local_1c * 8) = DAT_00168c08;
  }
  return o;
}

Assistant:

static void*
matfxOpen(void *o, int32, int32)
{
	// init dummy pipelines
	matFXGlobals.dummypipe = ObjPipeline::create();
	matFXGlobals.dummypipe->pluginID = 0; //ID_MATFX;
	matFXGlobals.dummypipe->pluginData = 0;
	for(uint i = 0; i < nelem(matFXGlobals.pipelines); i++)
		matFXGlobals.pipelines[i] = matFXGlobals.dummypipe;
	return o;
}